

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevolute::IntLoadConstraint_C
          (ChLinkRevolute *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  undefined1 auVar1 [16];
  int iVar2;
  Scalar *pSVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar7;
  undefined8 in_XMM1_Qb;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  double local_58;
  undefined1 local_48 [40];
  undefined1 auVar6 [32];
  
  iVar2 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar2 != '\0') {
    local_58 = c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                   m_storage.m_data.array[4];
    local_48._0_8_ =
         c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
             m_data.array[0];
    local_48._8_8_ =
         c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
             m_data.array[1];
    local_48._16_8_ =
         c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
             m_data.array[2];
    auVar10._24_8_ =
         c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
             m_data.array[3];
    auVar10._0_24_ = local_48._0_24_;
    if (do_clamp) {
      auVar1._8_8_ = in_XMM1_Qb;
      auVar1._0_8_ = recovery_clamp;
      auVar5._8_8_ = recovery_clamp;
      auVar5._0_8_ = recovery_clamp;
      auVar6._16_8_ = recovery_clamp;
      auVar6._0_16_ = auVar5;
      auVar6._24_8_ = recovery_clamp;
      auVar4._8_8_ = 0x8000000000000000;
      auVar4._0_8_ = 0x8000000000000000;
      auVar4 = vxorpd_avx512vl(auVar5,auVar4);
      uVar7 = auVar4._0_8_;
      auVar8._8_8_ = uVar7;
      auVar8._0_8_ = uVar7;
      auVar8._16_8_ = uVar7;
      auVar8._24_8_ = uVar7;
      auVar10 = vmaxpd_avx(auVar10,auVar8);
      auVar10 = vminpd_avx(auVar10,auVar6);
      local_48._0_24_ = auVar10._0_24_;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_58;
      auVar4 = vmaxsd_avx(auVar9,auVar4);
      auVar4 = vminsd_avx(auVar4,auVar1);
      local_58 = auVar4._0_8_;
    }
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)off_L);
    *pSVar3 = (double)local_48._0_8_ + *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 1));
    auVar4 = vpermilpd_avx(local_48._0_16_,1);
    *pSVar3 = auVar4._0_8_ + *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 2));
    *pSVar3 = (double)local_48._16_8_ + *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 3));
    auVar4 = vpermilpd_avx(local_48._0_16_,1);
    *pSVar3 = auVar4._0_8_ + *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 4));
    *pSVar3 = local_58 + *pSVar3;
  }
  return;
}

Assistant:

void ChLinkRevolute::IntLoadConstraint_C(const unsigned int off_L,  ///< offset in Qc residual
                                         ChVectorDynamic<>& Qc,     ///< result: the Qc residual, Qc += c*C
                                         const double c,            ///< a scaling factor
                                         bool do_clamp,             ///< apply clamping to c*C?
                                         double recovery_clamp      ///< value for min/max clamping of c*C
                                         ) {
    if (!IsActive())
        return;

    double cnstr_x_violation = c * m_C(0);
    double cnstr_y_violation = c * m_C(1);
    double cnstr_z_violation = c * m_C(2);
    double cnstr_uw_violation = c * m_C(3);
    double cnstr_vw_violation = c * m_C(4);

    if (do_clamp) {
        cnstr_x_violation = ChMin(ChMax(cnstr_x_violation, -recovery_clamp), recovery_clamp);
        cnstr_y_violation = ChMin(ChMax(cnstr_y_violation, -recovery_clamp), recovery_clamp);
        cnstr_z_violation = ChMin(ChMax(cnstr_z_violation, -recovery_clamp), recovery_clamp);
        cnstr_uw_violation = ChMin(ChMax(cnstr_uw_violation, -recovery_clamp), recovery_clamp);
        cnstr_vw_violation = ChMin(ChMax(cnstr_vw_violation, -recovery_clamp), recovery_clamp);
    }
    Qc(off_L + 0) += cnstr_x_violation;
    Qc(off_L + 1) += cnstr_y_violation;
    Qc(off_L + 2) += cnstr_z_violation;
    Qc(off_L + 3) += cnstr_uw_violation;
    Qc(off_L + 4) += cnstr_vw_violation;
}